

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

int __thiscall RegexTree::block_len(RegexTree *this,char *start)

{
  int local_28;
  int local_24;
  int i;
  int stack;
  char *start_local;
  RegexTree *this_local;
  
  local_24 = 1;
  local_28 = 0;
  while( true ) {
    if (start[local_28] == '\0') {
      return -1;
    }
    if (start[local_28] == '(') {
      local_24 = local_24 + 1;
    }
    if (start[local_28] == ')') {
      local_24 = local_24 + -1;
    }
    if (local_24 == 0) break;
    local_28 = local_28 + 1;
  }
  return local_28 + 1;
}

Assistant:

int RegexTree::block_len(const char *start) {
    int stack = 1;
    for (int i = 0; start[i] != '\0'; i++) {
        if (start[i] == '(') ++stack;
        if (start[i] == ')') --stack;
        if (stack == 0) return i + 1;
    }
    return -1;
}